

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O2

SampledSpectrum __thiscall
pbrt::ConductorBxDF::f(ConductorBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode)

{
  undefined1 auVar1 [16];
  float cosTheta_i;
  Float FVar2;
  Float FVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar10 [56];
  undefined1 auVar7 [64];
  undefined1 extraout_var [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar15 [64];
  undefined1 in_register_000012c4 [12];
  Vector3<float> VVar16;
  SampledSpectrum SVar17;
  SampledSpectrum F;
  Tuple3<pbrt::Vector3,_float> local_98;
  Tuple3<pbrt::Vector3,_float> local_88;
  Tuple3<pbrt::Vector3,_float> local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  SampledSpectrum local_40;
  SampledSpectrum local_30;
  undefined1 auVar14 [56];
  
  local_88.z = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar15._8_56_ = wi._8_56_;
  auVar15._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar11._4_60_ = wo._12_60_;
  auVar11._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._8_56_ = wo._8_56_;
  auVar6._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_78._0_8_ = vmovlps_avx(auVar6._0_16_);
  local_88._0_8_ = vmovlps_avx(auVar15._0_16_);
  if (((auVar11._0_4_ * local_88.z <= 0.0) ||
      (auVar4 = vminss_avx(ZEXT416((uint)(this->mfDistrib).alpha_y),
                           ZEXT416((uint)(this->mfDistrib).alpha_x)), auVar4._0_4_ < 0.001)) ||
     ((auVar11._0_4_ == 0.0 && (!NAN(auVar11._0_4_))))) {
    SVar17.values.values = (array<float,_4>)ZEXT816(0);
  }
  else {
    SVar17.values.values = (array<float,_4>)ZEXT816(0);
    if ((local_88.z != 0.0) || (NAN(local_88.z))) {
      local_98.z = auVar11._0_4_ + local_88.z;
      auVar4._0_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.x +
                     wo.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar4._4_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.y +
                     wo.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar4._8_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.z +
                     wo.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar4._12_4_ = wi._12_4_ + wo._12_4_;
      local_98._0_8_ = vmovlps_avx(auVar4);
      if ((local_98.z == 0.0) && ((!NAN(local_98.z) && (ABS(auVar4._0_4_) == 0.0)))) {
        auVar4 = vmovshdup_avx(auVar4);
        if ((auVar4._0_4_ == 0.0) && (!NAN(auVar4._0_4_))) {
          return (SampledSpectrum)(array<float,_4>)ZEXT816(0);
        }
      }
      auVar5._8_4_ = 0x7fffffff;
      auVar5._0_8_ = 0x7fffffff7fffffff;
      auVar5._12_4_ = 0x7fffffff;
      local_58 = vandps_avx(auVar11._0_16_,auVar5);
      auVar14 = ZEXT856(local_58._8_8_);
      auVar1._4_12_ = in_register_000012c4;
      auVar1._0_4_ = local_88.z;
      local_68 = vandps_avx(auVar1,auVar5);
      auVar10 = ZEXT856(local_68._8_8_);
      local_78.z = auVar11._0_4_;
      VVar16 = Normalize<float>((Vector3<float> *)&local_98);
      local_98.z = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar7._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar7._8_56_ = auVar10;
      local_98._0_8_ = vmovlps_avx(auVar7._0_16_);
      cosTheta_i = AbsDot<float>((Vector3<float> *)&local_88,(Vector3<float> *)&local_98);
      auVar10 = extraout_var;
      SVar17 = FrConductor(cosTheta_i,&this->eta,&this->k);
      auVar12._0_8_ = SVar17.values.values._8_8_;
      auVar12._8_56_ = auVar14;
      auVar8._0_8_ = SVar17.values.values._0_8_;
      auVar8._8_56_ = auVar10;
      local_30.values.values = (array<float,_4>)vmovlhps_avx(auVar8._0_16_,auVar12._0_16_);
      FVar2 = TrowbridgeReitzDistribution::D(&this->mfDistrib,(Vector3f *)&local_98);
      FVar3 = TrowbridgeReitzDistribution::G
                        (&this->mfDistrib,(Vector3f *)&local_78,(Vector3f *)&local_88);
      auVar10 = (undefined1  [56])0x0;
      SVar17 = SampledSpectrum::operator*(&local_30,FVar3 * FVar2);
      auVar13._0_8_ = SVar17.values.values._8_8_;
      auVar13._8_56_ = auVar14;
      auVar9._0_8_ = SVar17.values.values._0_8_;
      auVar9._8_56_ = auVar10;
      local_40.values.values = (array<float,_4>)vmovlhps_avx(auVar9._0_16_,auVar13._0_16_);
      SVar17 = SampledSpectrum::operator/
                         (&local_40,(float)local_68._0_4_ * 4.0 * (float)local_58._0_4_);
    }
  }
  return (array<float,_4>)(array<float,_4>)SVar17;
}

Assistant:

f(Vector3f wo, Vector3f wi, TransportMode mode) const {
        if (!SameHemisphere(wo, wi))
            return {};
        if (mfDistrib.EffectivelySmooth())
            return {};
        // Evaluate Torrance--Sparrow model for conductor BRDF
        // Compute cosines and $\wh$ for conductor BRDF
        Float cosTheta_o = AbsCosTheta(wo), cosTheta_i = AbsCosTheta(wi);
        if (cosTheta_i == 0 || cosTheta_o == 0)
            return {};
        Vector3f wh = wi + wo;
        if (wh.x == 0 && wh.y == 0 && wh.z == 0)
            return {};
        wh = Normalize(wh);

        // Evaluate Fresnel factor _F_ for conductor BRDF
        Float frCosTheta_i = AbsDot(wi, wh);
        SampledSpectrum F = FrConductor(frCosTheta_i, eta, k);

        return mfDistrib.D(wh) * mfDistrib.G(wo, wi) * F / (4 * cosTheta_i * cosTheta_o);
    }